

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_dmc.c
# Opt level: O0

void NES_DMC_np_SetClock(void *chip,UINT32 c)

{
  int iVar1;
  NES_DMC *dmc;
  UINT32 c_local;
  void *chip_local;
  
  *(UINT32 *)((long)chip + 0x4009c) = c;
  iVar1 = *(int *)((long)chip + 0x4009c) + -0x195e8f;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  if (iVar1 < 0x3e9) {
    NES_DMC_np_SetPal(chip,true);
  }
  else {
    NES_DMC_np_SetPal(chip,false);
  }
  return;
}

Assistant:

void NES_DMC_np_SetClock(void* chip, UINT32 c)
{
	NES_DMC* dmc = (NES_DMC*)chip;

	dmc->clock = c;
	
	if (abs((int)dmc->clock - DEFAULT_CLK_PAL) <= 1000)	// check for approximately DEFAULT_CLK_PAL
		NES_DMC_np_SetPal(dmc, true);
	else
		NES_DMC_np_SetPal(dmc, false);
}